

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

PC * __thiscall Hpipe::Context::without(PC *__return_storage_ptr__,Context *this,CharItem *fip)

{
  pointer ppCVar1;
  CharItem *item;
  uint ind;
  PcMaker pm;
  
  anon_unknown_7::PcMaker::PcMaker(&pm,this);
  ind = 0;
  while( true ) {
    ppCVar1 = (this->pos).
              super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
              super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->pos).
                      super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      .
                      super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3) <= (ulong)ind
       ) break;
    item = ppCVar1[ind];
    if (item != fip) {
      anon_unknown_7::PcMaker::add(&pm,item,ind,true);
    }
    ind = ind + 1;
  }
  std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::pair(__return_storage_ptr__,&pm.res);
  std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::~pair(&pm.res);
  return __return_storage_ptr__;
}

Assistant:

Context::PC Context::without( const CharItem *fip ) const {
    PcMaker pm( this );

    for( unsigned i = 0; i < pos.size(); ++i )
        if ( pos[ i ] != fip )
            pm.add( pos[ i ], i );

    return pm.out();
}